

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O0

void WriteTableDescriptionString(ostream *strmOut,TableId ti)

{
  fontTableId32 fVar1;
  ostream *poVar2;
  TableId in_ESI;
  ostream *in_RDI;
  int in_stack_0000001c;
  double dCompressionRatio;
  char csTagStr [8];
  uint32 nTag;
  GrcManager *this;
  GrcManager *in_stack_ffffffffffffffa0;
  string local_40 [32];
  double local_20;
  char local_18;
  undefined1 local_17;
  undefined1 local_16;
  undefined1 local_15;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  undefined4 local_10;
  TableId local_c;
  ostream *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  fVar1 = TtfUtil::TableIdTag(in_ESI);
  local_18 = ' ';
  local_10._3_1_ = (undefined1)(fVar1 >> 0x18);
  local_17 = local_10._3_1_;
  local_10._2_1_ = (undefined1)(fVar1 >> 0x10);
  local_16 = local_10._2_1_;
  local_10._1_1_ = (undefined1)(fVar1 >> 8);
  local_15 = local_10._1_1_;
  local_10._0_1_ = (undefined1)fVar1;
  local_14 = (undefined1)local_10;
  local_13 = 0x3a;
  local_12 = 0x20;
  local_11 = 0;
  this = &g_cman;
  local_10 = fVar1;
  local_20 = GrcManager::CompressionRatio(in_stack_ffffffffffffffa0,0);
  poVar2 = std::operator<<(local_8,&local_18);
  GrcManager::TableVersion(this,local_c);
  VersionString_abi_cxx11_(in_stack_0000001c);
  std::operator<<(poVar2,local_40);
  std::__cxx11::string::~string(local_40);
  if ((local_20 != 0.0) || (NAN(local_20))) {
    poVar2 = std::operator<<(local_8," compressed (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)(100.0 / (local_20 + 1.0)));
    std::operator<<(poVar2,"% of original)");
  }
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void WriteTableDescriptionString(std::ostream& strmOut, TableId ti)
{
    uint32 nTag = TtfUtil::TableIdTag(ti);
    char csTagStr[] = {' ', (char)(nTag >> 24), (char)(nTag >> 16), (char)(nTag >> 8), (char)nTag, ':', ' ', 0 };
    double dCompressionRatio = g_cman.CompressionRatio(ti);
    strmOut << csTagStr << VersionString(g_cman.TableVersion(ti));

    if (dCompressionRatio)
        strmOut << " compressed (" << int(100/(1+dCompressionRatio)) << "% of original)";
    strmOut << std::endl;
}